

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

QRegion __thiscall QPainter::clipRegion(QPainter *this)

{
  bool bVar1;
  TransformationType TVar2;
  QPainterPrivate *this_00;
  pointer pQVar3;
  QPainterClipInfo *a;
  QRegion *other;
  QMessageLogger *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QPainterClipInfo *info;
  add_const_t<QList<QPainterClipInfo>_> *__range1;
  bool lastWasNothing;
  QPainterPrivate *d;
  QRegion *region;
  const_iterator __end1;
  const_iterator __begin1;
  QTransform matrix_3;
  QTransform matrix_2;
  QTransform matrix_1;
  QTransform matrix;
  QPainterPrivate *in_stack_fffffffffffffb88;
  QRect *r;
  QList<QPainterClipInfo> *matrix_00;
  RegionType t;
  undefined6 in_stack_fffffffffffffbb8;
  byte bVar4;
  undefined1 uVar5;
  QRegion *in_stack_fffffffffffffbf0;
  QRegion in_stack_fffffffffffffbf8;
  QRect in_stack_fffffffffffffc00;
  QRect in_stack_fffffffffffffc40;
  QTransform *in_stack_fffffffffffffc50;
  QRegion local_390 [3];
  QRect local_378;
  QRegion local_318 [18];
  QRegion local_288 [3];
  QPainterClipInfo *local_270;
  const_iterator local_268;
  const_iterator local_260;
  char local_258 [32];
  undefined1 local_238 [80];
  undefined1 local_1e8 [320];
  undefined1 local_a8 [80];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  r = in_RDI;
  this_00 = d_func((QPainter *)0x594ef2);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x594f08);
  if (bVar1) {
    uVar5 = 0;
    *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)in_RDI);
    bVar4 = 1;
    if ((this_00->field_0xf8 & 1) == 0) {
      std::unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>::operator->
                ((unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_> *)0x594f84);
      QPainterPrivate::updateInvMatrix(in_stack_fffffffffffffb88);
    }
    pQVar3 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                       ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x594fa9);
    matrix_00 = &pQVar3->clipInfo;
    local_260.i = (QPainterClipInfo *)&DAT_aaaaaaaaaaaaaaaa;
    local_260 = QList<QPainterClipInfo>::begin((QList<QPainterClipInfo> *)in_RDI);
    local_268.i = (QPainterClipInfo *)&DAT_aaaaaaaaaaaaaaaa;
    local_268 = QList<QPainterClipInfo>::end((QList<QPainterClipInfo> *)in_RDI);
    while( true ) {
      local_270 = local_268.i;
      bVar1 = QList<QPainterClipInfo>::const_iterator::operator!=(&local_260,local_268);
      if (!bVar1) break;
      a = QList<QPainterClipInfo>::const_iterator::operator*(&local_260);
      other = (QRegion *)(ulong)a->clipType;
      switch(other) {
      case (QRegion *)0x0:
        memcpy(local_58,&DAT_00bbf150,0x50);
        QTransform::operator*(in_stack_fffffffffffffc50,in_stack_fffffffffffffc40._8_8_);
        if ((bVar4 & 1) == 0) {
          if (a->operation == IntersectClip) {
            ::operator*((QRegion *)r,(QTransform *)in_RDI);
            QRegion::operator&=((QRegion *)in_RSI,(QRegion *)r);
            QRegion::~QRegion((QRegion *)in_RDI);
          }
          else if (a->operation == NoClip) {
            bVar4 = 1;
            QRegion::QRegion(local_288);
            QRegion::operator=((QRegion *)in_RDI,other);
            QRegion::~QRegion((QRegion *)in_RDI);
          }
          else {
            ::operator*((QRegion *)r,(QTransform *)in_RDI);
            QRegion::operator=((QRegion *)in_RDI,other);
            QRegion::~QRegion((QRegion *)in_RDI);
          }
        }
        else {
          ::operator*((QRegion *)r,(QTransform *)in_RDI);
          QRegion::operator=((QRegion *)in_RDI,other);
          QRegion::~QRegion((QRegion *)in_RDI);
          bVar4 = 0;
        }
        break;
      case (QRegion *)0x1:
        memcpy(local_a8,&DAT_00bbf1a0,0x50);
        QTransform::operator*(in_stack_fffffffffffffc50,in_stack_fffffffffffffc40._8_8_);
        if ((bVar4 & 1) == 0) {
          if (a->operation == IntersectClip) {
            ::operator*((QPainterPath *)r,(QTransform *)in_RDI);
            QTransform::QTransform((QTransform *)in_RDI);
            QPainterPath::toFillPolygon
                      ((QPainterPath *)CONCAT17(uVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb8)),
                       (QTransform *)matrix_00);
            QPolygonF::toPolygon((QPolygonF *)a);
            QPainterPath::fillRule((QPainterPath *)in_RDI);
            QRegion::QRegion((QRegion *)matrix_00,(QPolygon *)a,(FillRule)((ulong)in_RSI >> 0x20));
            QRegion::operator&=((QRegion *)in_RSI,(QRegion *)r);
            QRegion::~QRegion((QRegion *)in_RDI);
            QPolygon::~QPolygon((QPolygon *)0x595397);
            QPolygonF::~QPolygonF((QPolygonF *)0x5953a4);
            QPainterPath::~QPainterPath((QPainterPath *)0x5953b1);
          }
          else if (a->operation == NoClip) {
            bVar4 = 1;
            QRegion::QRegion(local_318);
            QRegion::operator=((QRegion *)in_RDI,other);
            QRegion::~QRegion((QRegion *)in_RDI);
          }
          else {
            ::operator*((QPainterPath *)r,(QTransform *)in_RDI);
            QTransform::QTransform((QTransform *)in_RDI);
            QPainterPath::toFillPolygon
                      ((QPainterPath *)CONCAT17(uVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb8)),
                       (QTransform *)matrix_00);
            QPolygonF::toPolygon((QPolygonF *)a);
            QPainterPath::fillRule((QPainterPath *)in_RDI);
            QRegion::QRegion((QRegion *)matrix_00,(QPolygon *)a,(FillRule)((ulong)in_RSI >> 0x20));
            QRegion::operator=((QRegion *)in_RDI,other);
            QRegion::~QRegion((QRegion *)in_RDI);
            QPolygon::~QPolygon((QPolygon *)0x5954a5);
            QPolygonF::~QPolygonF((QPolygonF *)0x5954b2);
            QPainterPath::~QPainterPath((QPainterPath *)0x5954bf);
          }
        }
        else {
          ::operator*((QPainterPath *)r,(QTransform *)in_RDI);
          QTransform::QTransform((QTransform *)in_RDI);
          QPainterPath::toFillPolygon
                    ((QPainterPath *)CONCAT17(uVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb8)),
                     (QTransform *)matrix_00);
          QPolygonF::toPolygon((QPolygonF *)a);
          QPainterPath::fillRule((QPainterPath *)in_RDI);
          QRegion::QRegion((QRegion *)matrix_00,(QPolygon *)a,(FillRule)((ulong)in_RSI >> 0x20));
          QRegion::operator=((QRegion *)in_RDI,other);
          QRegion::~QRegion((QRegion *)in_RDI);
          QPolygon::~QPolygon((QPolygon *)0x5952b6);
          QPolygonF::~QPolygonF((QPolygonF *)0x5952c3);
          QPainterPath::~QPainterPath((QPainterPath *)0x5952d0);
          bVar4 = 0;
        }
        break;
      case (QRegion *)0x2:
        memcpy(local_1e8,&DAT_00bbf1f0,0x50);
        QTransform::operator*(in_stack_fffffffffffffc50,in_stack_fffffffffffffc40._8_8_);
        t = (RegionType)((ulong)matrix_00 >> 0x20);
        if ((bVar4 & 1) == 0) {
          if (a->operation == IntersectClip) {
            TVar2 = QTransform::type((QTransform *)r);
            if ((int)TVar2 < 3) {
              local_378 = QTransform::mapRect(in_stack_fffffffffffffc00._8_8_,
                                              in_stack_fffffffffffffc00._0_8_);
              QRegion::operator&=((QRegion *)in_RSI,r);
            }
            else {
              QRegion::QRegion((QRegion *)this_00,
                               (QRect *)CONCAT17(uVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb8)),
                               (RegionType)((ulong)matrix_00 >> 0x20));
              QTransform::map((QTransform *)in_stack_fffffffffffffbf8.d,in_stack_fffffffffffffbf0);
              QRegion::operator&=((QRegion *)in_RSI,(QRegion *)r);
              QRegion::~QRegion((QRegion *)in_RDI);
              QRegion::~QRegion((QRegion *)in_RDI);
            }
          }
          else if (a->operation == NoClip) {
            bVar4 = 1;
            QRegion::QRegion(local_390);
            QRegion::operator=((QRegion *)in_RDI,other);
            QRegion::~QRegion((QRegion *)in_RDI);
          }
          else {
            QRegion::QRegion((QRegion *)this_00,
                             (QRect *)CONCAT17(uVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb8)),t);
            ::operator*((QRegion *)r,(QTransform *)in_RDI);
            QRegion::operator=((QRegion *)in_RDI,other);
            QRegion::~QRegion((QRegion *)in_RDI);
            QRegion::~QRegion((QRegion *)in_RDI);
          }
        }
        else {
          QRegion::QRegion((QRegion *)this_00,
                           (QRect *)CONCAT17(uVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb8)),t);
          ::operator*((QRegion *)r,(QTransform *)in_RDI);
          QRegion::operator=((QRegion *)in_RDI,other);
          QRegion::~QRegion((QRegion *)in_RDI);
          QRegion::~QRegion((QRegion *)in_RDI);
          bVar4 = 0;
        }
        break;
      case (QRegion *)0x3:
        memcpy(local_238,&DAT_00bbf240,0x50);
        QTransform::operator*(in_stack_fffffffffffffc50,in_stack_fffffffffffffc40._8_8_);
        if ((bVar4 & 1) == 0) {
          if (a->operation == IntersectClip) {
            TVar2 = QTransform::type((QTransform *)r);
            if ((int)TVar2 < 3) {
              QRectF::toRect((QRectF *)CONCAT17(uVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb8)));
              QTransform::mapRect(in_stack_fffffffffffffc00._8_8_,in_stack_fffffffffffffc00._0_8_);
              QRegion::operator&=((QRegion *)in_RSI,r);
            }
            else {
              in_stack_fffffffffffffc00 =
                   QRectF::toRect((QRectF *)
                                  CONCAT17(uVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb8)));
              QRegion::QRegion((QRegion *)this_00,
                               (QRect *)CONCAT17(uVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb8)),
                               (RegionType)((ulong)matrix_00 >> 0x20));
              QTransform::map((QTransform *)in_stack_fffffffffffffbf8.d,in_stack_fffffffffffffbf0);
              QRegion::operator&=((QRegion *)in_RSI,(QRegion *)r);
              QRegion::~QRegion((QRegion *)in_RDI);
              QRegion::~QRegion((QRegion *)in_RDI);
            }
          }
          else if (a->operation == NoClip) {
            bVar4 = 1;
            QRegion::QRegion((QRegion *)&stack0xfffffffffffffbf8);
            QRegion::operator=((QRegion *)in_RDI,other);
            QRegion::~QRegion((QRegion *)in_RDI);
          }
          else {
            QRectF::toRect((QRectF *)CONCAT17(uVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb8)));
            QRegion::QRegion((QRegion *)this_00,
                             (QRect *)CONCAT17(uVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb8)),
                             (RegionType)((ulong)matrix_00 >> 0x20));
            ::operator*((QRegion *)r,(QTransform *)in_RDI);
            QRegion::operator=((QRegion *)in_RDI,other);
            QRegion::~QRegion((QRegion *)in_RDI);
            QRegion::~QRegion((QRegion *)in_RDI);
          }
        }
        else {
          in_stack_fffffffffffffc40 =
               QRectF::toRect((QRectF *)CONCAT17(uVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb8)));
          QRegion::QRegion((QRegion *)this_00,
                           (QRect *)CONCAT17(uVar5,CONCAT16(bVar4,in_stack_fffffffffffffbb8)),
                           (RegionType)((ulong)matrix_00 >> 0x20));
          ::operator*((QRegion *)r,(QTransform *)in_RDI);
          QRegion::operator=((QRegion *)in_RDI,other);
          QRegion::~QRegion((QRegion *)in_RDI);
          QRegion::~QRegion((QRegion *)in_RDI);
          bVar4 = 0;
        }
      }
      QList<QPainterClipInfo>::const_iterator::operator++(&local_260);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RSI,(char *)r,(int)((ulong)in_RDI >> 0x20),(char *)in_stack_fffffffffffffb88);
    QMessageLogger::warning(local_258,"QPainter::clipRegion: Painter not active");
    QRegion::QRegion((QRegion *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QRegion)(QRegionData *)r;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QPainter::clipRegion() const
{
    Q_D(const QPainter);
    if (!d->engine) {
        qWarning("QPainter::clipRegion: Painter not active");
        return QRegion();
    }

    QRegion region;
    bool lastWasNothing = true;

    if (!d->txinv)
        const_cast<QPainter *>(this)->d_ptr->updateInvMatrix();

    // ### Falcon: Use QPainterPath
    for (const QPainterClipInfo &info : std::as_const(d->state->clipInfo)) {
        switch (info.clipType) {

        case QPainterClipInfo::RegionClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = info.region * matrix;
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip)
                region &= info.region * matrix;
            else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else
                region = info.region * matrix;
            break;
        }

        case QPainterClipInfo::PathClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = QRegion((info.path * matrix).toFillPolygon().toPolygon(),
                                 info.path.fillRule());
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip) {
                region &= QRegion((info.path * matrix).toFillPolygon().toPolygon(),
                                  info.path.fillRule());
            } else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else {
                region = QRegion((info.path * matrix).toFillPolygon().toPolygon(),
                                 info.path.fillRule());
            }
            break;
        }

        case QPainterClipInfo::RectClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = QRegion(info.rect) * matrix;
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip) {
                // Use rect intersection if possible.
                if (matrix.type() <= QTransform::TxScale)
                    region &= matrix.mapRect(info.rect);
                else
                    region &= matrix.map(QRegion(info.rect));
            } else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else {
                region = QRegion(info.rect) * matrix;
            }
            break;
        }

        case QPainterClipInfo::RectFClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = QRegion(info.rectf.toRect()) * matrix;
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip) {
                // Use rect intersection if possible.
                if (matrix.type() <= QTransform::TxScale)
                    region &= matrix.mapRect(info.rectf.toRect());
                else
                    region &= matrix.map(QRegion(info.rectf.toRect()));
            } else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else {
                region = QRegion(info.rectf.toRect()) * matrix;
            }
            break;
        }
        }
    }

    return region;
}